

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O1

void __thiscall
optimization::global_expr_move::BlockOps::BlockOps(BlockOps *this,BasicBlk *blk,bool offset)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  uint32_t uVar3;
  uint uVar4;
  pointer puVar5;
  int iVar6;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar7;
  _Base_ptr p_Var8;
  undefined7 in_register_00000011;
  _Base_ptr p_Var9;
  Inst *pIVar10;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  pointer puVar11;
  bool bVar12;
  __hashtable *__h;
  anon_class_8_1_a78179b7_conflict local_150;
  _func_int **local_148;
  BlockOps *local_140;
  undefined4 local_134;
  _Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
  *local_130;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *local_128;
  undefined **local_120;
  Displayable local_118;
  undefined1 local_110 [16];
  __index_type local_100;
  undefined2 local_ff;
  Displayable local_f8;
  _Copy_ctor_base<false,_int,_mir::inst::VarId> local_f0;
  _func_int **local_d8;
  _func_int **local_d0;
  _func_int **local_c8;
  variant<int,_mir::inst::VarId> local_c0;
  _func_int **local_a8;
  variant<int,_mir::inst::VarId> local_a0;
  undefined1 local_88 [24];
  _Copy_ctor_base<false,_int,_mir::inst::VarId> local_70;
  undefined **local_58;
  uint32_t local_50;
  
  local_134 = (undefined4)CONCAT71(in_register_00000011,offset);
  (this->ops)._M_h._M_buckets = &(this->ops)._M_h._M_single_bucket;
  (this->ops)._M_h._M_bucket_count = 1;
  (this->ops)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ops)._M_h._M_element_count = 0;
  (this->ops)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ops)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ops)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->loads)._M_t._M_impl.super__Rb_tree_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loads)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stores)._M_t._M_impl.super__Rb_tree_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stores)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar11 = (blk->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (blk->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar5) {
    local_130 = (_Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
                 *)&this->loads;
    local_128 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                 *)&this->stores;
    local_d0 = (_func_int **)&PTR_display_001f0078;
    local_148 = (_func_int **)&PTR_display_001effc8;
    local_d8 = (_func_int **)&PTR_display_001f0258;
    local_140 = this;
    do {
      pIVar10 = (puVar11->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      iVar6 = (*(pIVar10->super_Displayable)._vptr_Displayable[1])(pIVar10);
      if (iVar6 == 1) {
        if ((pIVar10->super_Displayable)._vptr_Displayable != local_d0) {
          pIVar10 = (Inst *)0x0;
        }
        uVar3 = pIVar10[3].dest.id;
        local_a0.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
             *(__index_type *)&pIVar10[2].super_Displayable._vptr_Displayable;
        local_150.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_a0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_a0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_150,(variant<int,_mir::inst::VarId> *)&pIVar10[1].dest);
        local_a8 = local_148;
        local_a0.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
             *(undefined2 *)((long)&pIVar10[2].super_Displayable._vptr_Displayable + 1);
        local_c0.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
             *(__index_type *)&pIVar10[3].dest.super_Displayable._vptr_Displayable;
        local_150.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_c0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_c0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_150,(variant<int,_mir::inst::VarId> *)&pIVar10[2].dest.id);
        local_c8 = local_148;
        local_c0.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
             *(undefined2 *)((long)&pIVar10[3].dest.super_Displayable._vptr_Displayable + 1);
        local_120 = (undefined **)CONCAT44(local_120._4_4_,uVar3);
        local_100 = local_a0.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_150.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_110;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_a0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_150,&local_a0);
        local_118._vptr_Displayable = local_148;
        local_ff = local_a0.super__Variant_base<int,_mir::inst::VarId>.
                   super__Move_assign_alias<int,_mir::inst::VarId>.
                   super__Copy_assign_alias<int,_mir::inst::VarId>.
                   super__Move_ctor_alias<int,_mir::inst::VarId>.
                   super__Copy_ctor_alias<int,_mir::inst::VarId>.
                   super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        local_f0.super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
             local_c0.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_150.__lhs = &local_f0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_c0.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_150,&local_c0);
        local_f8._vptr_Displayable = local_148;
        local_f0.super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
             local_c0.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>::
        pair<optimization::global_expr_move::Op,_mir::inst::VarId_&,_true>
                  ((pair<const_optimization::global_expr_move::Op,_mir::inst::VarId> *)local_88,
                   (Op *)&local_120,&pIVar10->dest);
        std::
        _Hashtable<optimization::global_expr_move::Op,std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>,std::allocator<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<optimization::global_expr_move::Op>,optimization::global_expr_move::hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>
                  ((_Hashtable<optimization::global_expr_move::Op,std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>,std::allocator<std::pair<optimization::global_expr_move::Op_const,mir::inst::VarId>>,std::__detail::_Select1st,std::equal_to<optimization::global_expr_move::Op>,optimization::global_expr_move::hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_140,local_88);
      }
      else if ((char)local_134 != '\0') {
        iVar6 = (*(((puVar11->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar6 == 3) {
          if ((pIVar10->super_Displayable)._vptr_Displayable != local_d8) {
            pIVar10 = (Inst *)0x0;
          }
          pvVar7 = std::get<1ul,int,mir::inst::VarId>
                             ((variant<int,_mir::inst::VarId> *)&pIVar10[1].dest);
          uVar4 = pvVar7->id;
          p_Var9 = (local_140->stores)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = &p_Var1->_M_header;
          for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar12]) {
            bVar12 = *(uint *)&p_Var9[1]._M_parent < uVar4;
            if (!bVar12) {
              p_Var8 = p_Var9;
            }
          }
          p_Var9 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
             (p_Var9 = p_Var8, uVar4 < *(uint *)&p_Var8[1]._M_parent)) {
            p_Var9 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var9 == p_Var1) {
            local_120 = &PTR_display_001ee058;
            local_118._vptr_Displayable._0_4_ = uVar4;
            cVar2 = *(char *)&pIVar10[3].dest.super_Displayable._vptr_Displayable;
            local_f8._vptr_Displayable =
                 (_func_int **)CONCAT71((int7)((ulong)local_f8._vptr_Displayable >> 8),cVar2);
            local_150.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)(local_110 + 8);
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)cVar2 + 1]._M_data)
                      (&local_150,(variant<int,_mir::inst::VarId> *)&pIVar10[2].dest.id);
            local_110._0_8_ = local_148;
            local_f8._vptr_Displayable._1_2_ =
                 *(undefined2 *)((long)&pIVar10[3].dest.super_Displayable._vptr_Displayable + 1);
            local_88._0_8_ = &PTR_display_001ee058;
            local_88._8_4_ = (uint)local_118._vptr_Displayable;
            local_70.super__Variant_storage_alias<int,_mir::inst::VarId>._M_index =
                 (__index_type)local_f8._vptr_Displayable;
            local_150.__lhs = &local_70;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
              ::_S_vtable._M_arr[(long)(char)(__index_type)local_f8._vptr_Displayable + 1]._M_data)
                      (&local_150,(variant<int,_mir::inst::VarId> *)(local_110 + 8));
            local_88._16_8_ = local_148;
            local_70.super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_ =
                 local_f8._vptr_Displayable._1_2_;
            local_58 = &PTR_display_001ee058;
            local_50 = (pIVar10->dest).id;
            std::
            _Rb_tree<std::pair<mir::inst::VarId,mir::inst::Value>,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>,std::_Select1st<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>,std::less<std::pair<mir::inst::VarId,mir::inst::Value>>,std::allocator<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>>
            ::
            _M_insert_unique<std::pair<std::pair<mir::inst::VarId,mir::inst::Value>const,mir::inst::VarId>>
                      (local_130,
                       (pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>
                        *)local_88);
          }
        }
        else {
          iVar6 = (*(((puVar11->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                    super_Displayable)._vptr_Displayable[1])();
          if (iVar6 == 4) {
            std::
            _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
            ::_M_insert_unique<mir::inst::VarId_const&>(local_128,&pIVar10->dest);
          }
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar5);
  }
  return;
}

Assistant:

BlockOps(mir::inst::BasicBlk& blk, bool offset = false) {
    for (auto& inst : blk.inst) {
      auto& i = *inst;
      if (inst->inst_kind() == mir::inst::InstKind::Op) {
        auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
        ops.insert({Op(opInst->op, opInst->lhs, opInst->rhs), opInst->dest});
      } else if (offset) {
        if (inst->inst_kind() == mir::inst::InstKind::Load) {
          auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
          auto addr = std::get<mir::inst::VarId>(loadInst->src);
          if (stores.count(addr)) {
            continue;
          }
          loads.insert({{addr, loadInst->offset}, loadInst->dest});
        } else if (inst->inst_kind() == mir::inst::InstKind::Store) {
          auto storeInst = dynamic_cast<mir::inst::StoreOffsetInst*>(&i);
          stores.insert(storeInst->dest);
        }
      }
    }
  }